

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_wif_trace.cpp
# Opt level: O3

void __thiscall
sc_core::wif_trace_file::trace(wif_trace_file *this,uint64 *object_,string *name_,int width_)

{
  pointer *pppwVar1;
  iterator __position;
  bool bVar2;
  wif_uint64_trace *this_00;
  wif_uint64_trace *local_58;
  string local_50;
  
  bVar2 = sc_trace_file_base::add_trace_check(&this->super_sc_trace_file_base,name_);
  if (bVar2) {
    this_00 = (wif_uint64_trace *)operator_new(0x70);
    obtain_name_abi_cxx11_(&local_50,this);
    wif_uint64_trace::wif_uint64_trace(this_00,object_,name_,&local_50,width_);
    __position._M_current =
         (this->traces).
         super__Vector_base<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_58 = this_00;
    if (__position._M_current ==
        (this->traces).
        super__Vector_base<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>::_M_realloc_insert
                (&this->traces,__position,(value_type *)&local_58);
    }
    else {
      *__position._M_current = (wif_trace *)this_00;
      pppwVar1 = &(this->traces).
                  super__Vector_base<sc_core::wif_trace_*,_std::allocator<sc_core::wif_trace_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppwVar1 = *pppwVar1 + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void
wif_trace_file::trace( const unsigned& object_,
		       const std::string& name_,
		       const char** enum_literals_ )
{
    if( add_trace_check(name_) )
        traces.push_back( new wif_enum_trace( object_,
                                              name_,
                                              obtain_name(),
                                              enum_literals_ ) );
}